

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreMapping.c
# Opt level: O3

char * XCore_insn_name(csh handle,uint id)

{
  if (id - 0x79 < 0xffffff88) {
    return (char *)0x0;
  }
  return insn_name_maps[id].name;
}

Assistant:

const char *XCore_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= XCORE_INS_ENDING)
		return NULL;

	// handle special alias first
	for (i = 0; i < ARR_SIZE(alias_insn_names); i++) {
		if (alias_insn_names[i].id == id)
			return alias_insn_names[i].name;
	}

	return insn_name_maps[id].name;
#else
	return NULL;
#endif
}